

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_current.cpp
# Opt level: O3

void cpptrace::detail::do_prepare_unwind_interceptor(_func_char_size_t *intercept_unwind_handler)

{
  if (do_prepare_unwind_interceptor(char(*)(unsigned_long))::did_prepare == '\0') {
    detail::intercept_unwind_handler = intercept_unwind_handler;
    perform_typeinfo_surgery((type_info *)&unwind_interceptor::typeinfo,intercept_unwind);
    perform_typeinfo_surgery
              ((type_info *)&unconditional_unwind_interceptor::typeinfo,
               unconditional_exception_unwind_interceptor);
    do_prepare_unwind_interceptor(char(*)(unsigned_long))::did_prepare = '\x01';
  }
  return;
}

Assistant:

void do_prepare_unwind_interceptor(char(*intercept_unwind_handler)(std::size_t)) {
            static bool did_prepare = false;
            if(!did_prepare) {
                cpptrace::detail::intercept_unwind_handler = intercept_unwind_handler;
                try {
                    perform_typeinfo_surgery(typeid(cpptrace::detail::unwind_interceptor), intercept_unwind);
                    perform_typeinfo_surgery(
                        typeid(cpptrace::detail::unconditional_unwind_interceptor),
                        unconditional_exception_unwind_interceptor
                    );
                } catch(std::exception& e) {
                    std::fprintf(
                        stderr,
                        "Cpptrace: Exception occurred while preparing from_current support: %s\n",
                        e.what()
                    );
                } catch(...) {
                    std::fprintf(stderr, "Cpptrace: Unknown exception occurred while preparing from_current support\n");
                }
                did_prepare = true;
            }
        }